

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product.cpp
# Opt level: O2

AggregateFunction * duckdb::ProductFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::ProductState,double,double,duckdb::ProductFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,(LogicalType *)0x0,in_R8B
            );
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction ProductFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<ProductState, double, double, ProductFunction>(
	    LogicalType(LogicalTypeId::DOUBLE), LogicalType::DOUBLE);
}